

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelIdentifier.cpp
# Opt level: O2

ostream * csm::MIC::operator<<(ostream *os,RangeList *rangeList)

{
  ulong uVar1;
  Range *range;
  size_t i;
  ulong index;
  
  uVar1 = ((long)(rangeList->theRanges).
                 super__Vector_base<csm::MIC::RangeList::Range,_std::allocator<csm::MIC::RangeList::Range>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(rangeList->theRanges).
                super__Vector_base<csm::MIC::RangeList::Range,_std::allocator<csm::MIC::RangeList::Range>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x50;
  for (index = 0; uVar1 != index; index = index + 1) {
    range = RangeList::range(rangeList,index);
    operator<<(os,range);
    if (index < uVar1 - 1) {
      std::operator<<(os," , ");
    }
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os,const RangeList& rangeList)
{
   const size_t NUM_RANGES = rangeList.size();
   
   for (size_t i = 0; i < NUM_RANGES; ++i)
   {
      os << rangeList.range(i);
      
      if (i < (NUM_RANGES -1)) os << " , ";
   }
   
   return os;
}